

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

void leb_DecodeNodeAttributeArray_Quad
               (leb_Node node,int attributeArraySize,float (*attributeArray) [3])

{
  float *y;
  float *extraout_RDX;
  float *y_00;
  float *y_01;
  float *extraout_RDX_00;
  uint uVar1;
  long lVar2;
  bool bVar3;
  float fVar4;
  float attributeVector [3];
  lebMatrix3x3 m;
  undefined8 local_68;
  undefined4 local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40 [4];
  
  if (0 < attributeArraySize) {
    bVar3 = (node.id >> ((byte)((char)node.depth - 1) & 0x1f) & 1) != 0;
    y = (float *)(ulong)bVar3;
    local_50 = (float)bVar3;
    local_58 = 1.0 - local_50;
    local_54 = 0.0;
    local_40[1] = 0.0;
    local_4c = local_50;
    local_48 = local_58;
    local_44 = local_50;
    local_40[0] = local_50;
    local_40[2] = local_58;
    for (uVar1 = node.depth - 2; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
      leb__SplittingMatrix((float (*) [3])&local_58,(uint)((node.id >> (uVar1 & 0x1f) & 1) != 0));
      y = extraout_RDX;
    }
    for (lVar2 = 0; (ulong)(uint)attributeArraySize * 0xc - lVar2 != 0; lVar2 = lVar2 + 0xc) {
      local_60 = *(undefined4 *)((long)*attributeArray + lVar2 + 8);
      local_68 = *(undefined8 *)((long)*attributeArray + lVar2);
      fVar4 = leb__DotProduct((int)&local_58,(float *)&local_68,y);
      *(float *)((long)*attributeArray + lVar2) = fVar4;
      fVar4 = leb__DotProduct((int)&local_4c,(float *)&local_68,y_00);
      *(float *)((long)*attributeArray + lVar2 + 4) = fVar4;
      fVar4 = leb__DotProduct((int)local_40,(float *)&local_68,y_01);
      *(float *)((long)*attributeArray + lVar2 + 8) = fVar4;
      y = extraout_RDX_00;
    }
    return;
  }
  __assert_fail("attributeArraySize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x4d9,"void leb_DecodeNodeAttributeArray_Quad(const leb_Node, int, float (*)[3])");
}

Assistant:

LEBDEF void
leb_DecodeNodeAttributeArray_Quad(
    const leb_Node node,
    int attributeArraySize,
    float attributeArray[][3]
) {
    LEB_ASSERT(attributeArraySize > 0);

    lebMatrix3x3 m;
    float attributeVector[3];

    leb__DecodeTransformationMatrix_Quad(node, m);

    for (int i = 0; i < attributeArraySize; ++i) {
        memcpy(attributeVector, attributeArray[i], sizeof(attributeVector));
        attributeArray[i][0] = leb__DotProduct(3, m[0], attributeVector);
        attributeArray[i][1] = leb__DotProduct(3, m[1], attributeVector);
        attributeArray[i][2] = leb__DotProduct(3, m[2], attributeVector);
    }
}